

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

lword term_absexp(void)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  lword unaff_retaddr;
  lword val;
  undefined2 uVar5;
  undefined8 in_stack_fffffffffffffff0;
  char *pcVar4;
  lword *result;
  
  uVar5 = (undefined2)((ulong)in_stack_fffffffffffffff0 >> 0x10);
  result = (lword *)0x0;
  bVar1 = startofblock((char)((ulong)in_stack_fffffffffffffff0 >> 0x18));
  if (bVar1 != 0) {
    iVar2 = parse_expr(unaff_retaddr,result);
    if (iVar2 == 0) {
      pcVar4 = scriptname;
      uVar3 = getlineno();
      error(0x43,pcVar4,(ulong)uVar3);
      uVar5 = (undefined2)((ulong)pcVar4 >> 0x10);
    }
    endofblock((char)((ushort)uVar5 >> 8),(char)uVar5);
  }
  return (lword)result;
}

Assistant:

static lword term_absexp(void)
{
  lword val = 0;

  if (startofblock('(')) {
    if (!parse_expr(-1,&val))
      error(67,scriptname,getlineno());  /* Absolute number expected */
    endofblock('(',')');
  }
  return val;
}